

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O3

int __thiscall ncnn::Reshape::forward(Reshape *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  int *piVar6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  byte bVar10;
  int iVar11;
  Mat *pMVar12;
  byte bVar13;
  byte bVar14;
  uint _w;
  uint _h;
  uint _c;
  uint _d;
  byte bVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  undefined4 *puVar20;
  ulong uVar21;
  ulong uVar22;
  undefined4 *puVar23;
  ulong uVar24;
  undefined4 *puVar25;
  ulong uVar26;
  undefined4 *puVar27;
  Mat top_blob_permuted;
  int local_140;
  Mat local_118;
  Mat *local_d0;
  Mat local_c8;
  Mat local_78;
  
  sVar5 = bottom_blob->elemsize;
  uVar1 = bottom_blob->w;
  uVar2 = bottom_blob->h;
  uVar3 = bottom_blob->d;
  uVar4 = bottom_blob->c;
  uVar16 = uVar3 * uVar4 * uVar2 * uVar1;
  iVar17 = bottom_blob->dims;
  _w = this->w;
  _h = this->h;
  _d = this->d;
  _c = this->c;
  iVar18 = this->ndim;
  if (iVar18 == 1) {
    if (_w == 0) {
      _w = uVar1;
    }
    if (_w == 0xffffffff) {
      _w = uVar16;
    }
    bVar14 = 0;
    if (iVar17 == 1) {
      bVar15 = 0;
      bVar10 = 0;
      if (uVar1 == _w) {
LAB_0020537e:
        if (top_blob != bottom_blob) {
          piVar6 = bottom_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = top_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar6 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar6;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar17 = bottom_blob->w;
          iVar18 = bottom_blob->h;
          iVar11 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar17;
          top_blob->h = iVar18;
          top_blob->d = iVar11;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
          return 0;
        }
        return 0;
      }
    }
    else {
LAB_00205598:
      bVar10 = 0;
      bVar13 = 0;
LAB_0020559a:
      bVar15 = bVar13;
      bVar14 = bVar10;
      bVar10 = 0;
    }
  }
  else {
    if (iVar18 == 4) {
      if (_w == 0) {
        _w = uVar1;
      }
      if (_h == 0) {
        _h = uVar2;
      }
      if (_c == 0) {
        _c = uVar4;
      }
      if (_d == 0) {
        _d = uVar3;
      }
      if (_w == 0xffffffff) {
        uVar19 = (long)((ulong)(uint)((int)((long)(int)uVar16 / (long)(int)_c) >> 0x1f) << 0x20 |
                       (long)(int)uVar16 / (long)(int)_c & 0xffffffffU) / (long)(int)_d;
        _w = (uint)((long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff) /
                   (long)(int)_h);
      }
      if (_h == 0xffffffff) {
        uVar19 = (long)((ulong)(uint)((int)((long)(int)uVar16 / (long)(int)_c) >> 0x1f) << 0x20 |
                       (long)(int)uVar16 / (long)(int)_c & 0xffffffffU) / (long)(int)_d;
        _h = (uint)((long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff) /
                   (long)(int)_w);
      }
      if (_d == 0xffffffff) {
        uVar19 = (long)((ulong)(uint)((int)((long)(int)uVar16 / (long)(int)_c) >> 0x1f) << 0x20 |
                       (long)(int)uVar16 / (long)(int)_c & 0xffffffffU) / (long)(int)_h;
        _d = (uint)((long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff) /
                   (long)(int)_w);
      }
      if (_c == 0xffffffff) {
        uVar19 = (long)((ulong)(uint)((int)((long)(int)uVar16 / (long)(int)_d) >> 0x1f) << 0x20 |
                       (long)(int)uVar16 / (long)(int)_d & 0xffffffffU) / (long)(int)_h;
        _c = (uint)((long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff) /
                   (long)(int)_w);
      }
      bVar10 = 1;
      bVar13 = 0;
      if ((iVar17 == 4) && (uVar4 == _c)) {
        if (top_blob != bottom_blob) {
          piVar6 = bottom_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = top_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar6 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar6;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar17 = bottom_blob->w;
          iVar18 = bottom_blob->h;
          iVar11 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar17;
          top_blob->h = iVar18;
          top_blob->d = iVar11;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
        top_blob->w = _w;
        top_blob->h = _h;
        top_blob->d = _d;
        return 0;
      }
      goto LAB_0020559a;
    }
    if (iVar18 == 3) {
      if (_w == 0) {
        _w = uVar1;
      }
      if (_h == 0) {
        _h = uVar2;
      }
      if (_c == 0) {
        _c = uVar4;
      }
      if (_w == 0xffffffff) {
        _w = (uint)((long)((ulong)(uint)((int)((long)(int)uVar16 / (long)(int)_c) >> 0x1f) << 0x20 |
                          (long)(int)uVar16 / (long)(int)_c & 0xffffffffU) / (long)(int)_h);
      }
      if (_h == 0xffffffff) {
        _h = (uint)((long)((ulong)(uint)((int)((long)(int)uVar16 / (long)(int)_c) >> 0x1f) << 0x20 |
                          (long)(int)uVar16 / (long)(int)_c & 0xffffffffU) / (long)(int)_w);
      }
      if (_c == 0xffffffff) {
        _c = (uint)((long)((ulong)(uint)((int)((long)(int)uVar16 / (long)(int)_h) >> 0x1f) << 0x20 |
                          (long)(int)uVar16 / (long)(int)_h & 0xffffffffU) / (long)(int)_w);
      }
      bVar14 = 0;
      bVar10 = 1;
      if ((iVar17 == 3) && (uVar4 == _c)) {
        if (top_blob != bottom_blob) {
          piVar6 = bottom_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = top_blob->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          piVar6 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar6;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar17 = bottom_blob->w;
          iVar18 = bottom_blob->h;
          iVar11 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar17;
          top_blob->h = iVar18;
          top_blob->d = iVar11;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
        top_blob->w = _w;
        top_blob->h = _h;
        return 0;
      }
      bVar15 = 0;
    }
    else {
      if (iVar18 != 2) goto LAB_00205598;
      if (_w == 0) {
        _w = uVar1;
      }
      if (_h == 0) {
        _h = uVar2;
      }
      if (_w == 0xffffffff) {
        _w = (int)uVar16 / (int)_h;
      }
      if (_h == 0xffffffff) {
        _h = (int)uVar16 / (int)_w;
      }
      bVar14 = 0;
      bVar15 = 1;
      bVar10 = 0;
      bVar13 = 1;
      if (iVar17 != 2) goto LAB_0020559a;
      bVar10 = 0;
      if (uVar2 == _h) goto LAB_0020537e;
    }
  }
  local_d0 = top_blob;
  if ((((bool)((iVar17 == 4 & bVar14 | iVar17 == 3 & bVar10) & uVar4 == _c)) ||
      ((bool)(iVar17 == 2 & bVar15 & uVar2 == _h))) || (this->permute != 1)) {
    if (iVar18 == 1) {
      Mat::reshape(&local_118,bottom_blob,_w,opt->blob_allocator);
      if (&local_118 != top_blob) {
        if (local_118.refcount != (int *)0x0) {
          LOCK();
          *local_118.refcount = *local_118.refcount + 1;
          UNLOCK();
        }
        piVar6 = top_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_118.data;
        top_blob->refcount = local_118.refcount;
        top_blob->elemsize = local_118.elemsize;
        top_blob->elempack = local_118.elempack;
        top_blob->allocator = local_118.allocator;
        top_blob->dims = local_118.dims;
        top_blob->w = local_118.w;
        top_blob->h = local_118.h;
        top_blob->d = local_118.d;
        top_blob->c = local_118.c;
        top_blob->cstep = local_118.cstep;
      }
      if (local_118.refcount != (int *)0x0) {
        LOCK();
        *local_118.refcount = *local_118.refcount + -1;
        UNLOCK();
        if (*local_118.refcount == 0) {
          if (local_118.allocator == (Allocator *)0x0) {
            if (local_118.data != (void *)0x0) {
              free(local_118.data);
            }
          }
          else {
            (*(local_118.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar18 = this->ndim;
    }
    if (iVar18 == 2) {
      Mat::reshape(&local_118,bottom_blob,_w,_h,opt->blob_allocator);
      if (&local_118 != top_blob) {
        if (local_118.refcount != (int *)0x0) {
          LOCK();
          *local_118.refcount = *local_118.refcount + 1;
          UNLOCK();
        }
        piVar6 = top_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_118.data;
        top_blob->refcount = local_118.refcount;
        top_blob->elemsize = local_118.elemsize;
        top_blob->elempack = local_118.elempack;
        top_blob->allocator = local_118.allocator;
        top_blob->dims = local_118.dims;
        top_blob->w = local_118.w;
        top_blob->h = local_118.h;
        top_blob->d = local_118.d;
        top_blob->c = local_118.c;
        top_blob->cstep = local_118.cstep;
      }
      if (local_118.refcount != (int *)0x0) {
        LOCK();
        *local_118.refcount = *local_118.refcount + -1;
        UNLOCK();
        if (*local_118.refcount == 0) {
          if (local_118.allocator == (Allocator *)0x0) {
            if (local_118.data != (void *)0x0) {
              free(local_118.data);
            }
          }
          else {
            (*(local_118.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar18 = this->ndim;
    }
    if (iVar18 == 3) {
      Mat::reshape(&local_118,bottom_blob,_w,_h,_c,opt->blob_allocator);
      if (&local_118 != top_blob) {
        if (local_118.refcount != (int *)0x0) {
          LOCK();
          *local_118.refcount = *local_118.refcount + 1;
          UNLOCK();
        }
        piVar6 = top_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_118.data;
        top_blob->refcount = local_118.refcount;
        top_blob->elemsize = local_118.elemsize;
        top_blob->elempack = local_118.elempack;
        top_blob->allocator = local_118.allocator;
        top_blob->dims = local_118.dims;
        top_blob->w = local_118.w;
        top_blob->h = local_118.h;
        top_blob->d = local_118.d;
        top_blob->c = local_118.c;
        top_blob->cstep = local_118.cstep;
      }
      if (local_118.refcount != (int *)0x0) {
        LOCK();
        *local_118.refcount = *local_118.refcount + -1;
        UNLOCK();
        if (*local_118.refcount == 0) {
          if (local_118.allocator == (Allocator *)0x0) {
            if (local_118.data != (void *)0x0) {
              free(local_118.data);
            }
          }
          else {
            (*(local_118.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar18 = this->ndim;
    }
    if (iVar18 == 4) {
      Mat::reshape(&local_118,bottom_blob,_w,_h,_d,_c,opt->blob_allocator);
      if (&local_118 != top_blob) {
        if (local_118.refcount != (int *)0x0) {
          LOCK();
          *local_118.refcount = *local_118.refcount + 1;
          UNLOCK();
        }
        piVar6 = top_blob->refcount;
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_118.data;
        top_blob->refcount = local_118.refcount;
        top_blob->elemsize = local_118.elemsize;
        top_blob->elempack = local_118.elempack;
        top_blob->allocator = local_118.allocator;
        top_blob->dims = local_118.dims;
        top_blob->w = local_118.w;
        top_blob->h = local_118.h;
        top_blob->d = local_118.d;
        top_blob->c = local_118.c;
        top_blob->cstep = local_118.cstep;
      }
      if (local_118.refcount != (int *)0x0) {
        LOCK();
        *local_118.refcount = *local_118.refcount + -1;
        UNLOCK();
        if (*local_118.refcount == 0) {
          if (local_118.allocator == (Allocator *)0x0) {
            if (local_118.data != (void *)0x0) {
              free(local_118.data);
            }
          }
          else {
            (*(local_118.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      return 0;
    }
    return -100;
  }
  local_118.data = bottom_blob->data;
  local_118.refcount = bottom_blob->refcount;
  local_118.elempack = bottom_blob->elempack;
  local_118.allocator = bottom_blob->allocator;
  local_118.cstep = bottom_blob->cstep;
  if (local_118.refcount != (int *)0x0) {
    LOCK();
    *local_118.refcount = *local_118.refcount + 1;
    UNLOCK();
  }
  local_118.elemsize = sVar5;
  local_118.dims = iVar17;
  local_118.w = uVar1;
  local_118.h = uVar2;
  local_118.d = uVar3;
  local_118.c = uVar4;
  if (iVar17 == 2) {
    uVar1 = bottom_blob->w;
    uVar2 = bottom_blob->h;
    Mat::create(&local_118,uVar2,uVar1,sVar5,opt->workspace_allocator);
    local_140 = -100;
    if (((undefined4 *)local_118.data == (undefined4 *)0x0) ||
       ((long)local_118.c * local_118.cstep == 0)) goto LAB_0020623d;
    if (0 < (int)uVar1) {
      puVar20 = (undefined4 *)bottom_blob->data;
      uVar19 = 0;
      puVar23 = (undefined4 *)local_118.data;
      do {
        uVar21 = (ulong)uVar2;
        puVar25 = puVar20;
        if (0 < (int)uVar2) {
          do {
            *puVar23 = *puVar25;
            puVar23 = puVar23 + 1;
            puVar25 = puVar25 + uVar1;
            uVar21 = uVar21 - 1;
          } while (uVar21 != 0);
        }
        uVar19 = uVar19 + 1;
        puVar20 = puVar20 + 1;
      } while (uVar19 != uVar1);
      goto LAB_0020570a;
    }
  }
  else {
LAB_0020570a:
    if (iVar17 == 3) {
      uVar1 = bottom_blob->w;
      uVar2 = bottom_blob->h;
      uVar3 = bottom_blob->c;
      Mat::create(&local_118,uVar3,uVar1,uVar2,sVar5,opt->workspace_allocator);
      local_140 = -100;
      if (((undefined4 *)local_118.data == (undefined4 *)0x0) ||
         ((long)local_118.c * local_118.cstep == 0)) goto LAB_0020623d;
      if ((int)uVar2 < 1) goto LAB_002058ee;
      uVar19 = 0;
      do {
        if (0 < (int)uVar1) {
          sVar7 = bottom_blob->elemsize;
          puVar23 = (undefined4 *)(sVar7 * uVar19 * (long)bottom_blob->w + (long)bottom_blob->data);
          puVar20 = (undefined4 *)
                    (local_118.cstep * local_118.elemsize * uVar19 + (long)local_118.data);
          sVar8 = bottom_blob->cstep;
          uVar21 = 0;
          do {
            uVar24 = (ulong)uVar3;
            puVar25 = puVar23;
            if (0 < (int)uVar3) {
              do {
                *puVar20 = *puVar25;
                puVar20 = puVar20 + 1;
                puVar25 = (undefined4 *)((long)puVar25 + sVar7 * sVar8);
                uVar24 = uVar24 - 1;
              } while (uVar24 != 0);
            }
            uVar21 = uVar21 + 1;
            puVar23 = puVar23 + 1;
          } while (uVar21 != uVar1);
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar2);
    }
    if (iVar17 == 4) {
      uVar1 = bottom_blob->w;
      uVar2 = bottom_blob->h;
      uVar3 = bottom_blob->d;
      uVar4 = bottom_blob->c;
      Mat::create(&local_118,uVar4,uVar1,uVar2,uVar3,sVar5,opt->workspace_allocator);
      local_140 = -100;
      if (((undefined4 *)local_118.data == (undefined4 *)0x0) ||
         ((long)local_118.c * local_118.cstep == 0)) goto LAB_0020623d;
      if (0 < (int)uVar3) {
        uVar19 = 0;
        do {
          if (0 < (int)uVar2) {
            puVar20 = (undefined4 *)
                      (local_118.cstep * local_118.elemsize * uVar19 + (long)local_118.data);
            uVar21 = 0;
            do {
              if (0 < (int)uVar1) {
                sVar7 = bottom_blob->elemsize;
                puVar23 = (undefined4 *)
                          ((long)bottom_blob->w * sVar7 * ((long)bottom_blob->h * uVar19 + uVar21) +
                          (long)bottom_blob->data);
                sVar8 = bottom_blob->cstep;
                uVar24 = 0;
                do {
                  puVar25 = puVar23;
                  uVar26 = (ulong)uVar4;
                  if (0 < (int)uVar4) {
                    do {
                      *puVar20 = *puVar25;
                      puVar20 = puVar20 + 1;
                      puVar25 = (undefined4 *)((long)puVar25 + sVar7 * sVar8);
                      uVar26 = uVar26 - 1;
                    } while (uVar26 != 0);
                  }
                  uVar24 = uVar24 + 1;
                  puVar23 = puVar23 + 1;
                } while (uVar24 != uVar1);
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 != uVar2);
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar3);
      }
    }
  }
LAB_002058ee:
  pMVar12 = local_d0;
  iVar17 = this->ndim;
  if (iVar17 == 1) {
    Mat::reshape(&local_c8,&local_118,_w,opt->blob_allocator);
    pMVar12 = local_d0;
    Mat::operator=(local_d0,&local_c8);
    Mat::~Mat(&local_c8);
    if ((pMVar12->data == (void *)0x0) || (local_140 = 0, (long)local_d0->c * local_d0->cstep == 0))
    {
      local_140 = -100;
    }
    goto LAB_0020623d;
  }
  local_c8.cstep = 0;
  local_c8.data = (undefined4 *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  if (iVar17 == 2) {
    Mat::reshape(&local_78,&local_118,_h,_w,opt->workspace_allocator);
    Mat::operator=(&local_c8,&local_78);
    Mat::~Mat(&local_78);
    iVar17 = this->ndim;
  }
  if (iVar17 == 3) {
    Mat::reshape(&local_78,&local_118,_c,_w,_h,opt->workspace_allocator);
    Mat::operator=(&local_c8,&local_78);
    Mat::~Mat(&local_78);
    iVar17 = this->ndim;
  }
  if (iVar17 == 4) {
    Mat::reshape(&local_78,&local_118,_c,_w,_h,_d,opt->workspace_allocator);
    Mat::operator=(&local_c8,&local_78);
    Mat::~Mat(&local_78);
  }
  if ((undefined4 *)local_c8.data == (undefined4 *)0x0) {
    local_140 = -100;
  }
  else {
    local_140 = -100;
    if ((long)local_c8.c * local_c8.cstep != 0) {
      iVar17 = this->ndim;
      if (iVar17 == 2) {
        Mat::create(pMVar12,_w,_h,sVar5,opt->blob_allocator);
        puVar20 = (undefined4 *)pMVar12->data;
        if ((puVar20 == (undefined4 *)0x0) || ((long)pMVar12->c * pMVar12->cstep == 0))
        goto LAB_0020622b;
        if (0 < (int)_h) {
          uVar19 = 0;
          puVar23 = (undefined4 *)local_c8.data;
          do {
            uVar21 = (ulong)_w;
            puVar25 = puVar23;
            if (0 < (int)_w) {
              do {
                *puVar20 = *puVar25;
                puVar20 = puVar20 + 1;
                puVar25 = puVar25 + _h;
                uVar21 = uVar21 - 1;
              } while (uVar21 != 0);
            }
            uVar19 = uVar19 + 1;
            puVar23 = puVar23 + 1;
          } while (uVar19 != _h);
        }
        iVar17 = this->ndim;
      }
      pMVar12 = local_d0;
      if (iVar17 == 3) {
        Mat::create(local_d0,_w,_h,_c,sVar5,opt->blob_allocator);
        pvVar9 = pMVar12->data;
        if ((pvVar9 == (void *)0x0) || (sVar7 = pMVar12->cstep, (long)pMVar12->c * sVar7 == 0))
        goto LAB_0020622b;
        if (0 < (int)_c) {
          sVar8 = local_d0->elemsize;
          uVar19 = 0;
          puVar20 = (undefined4 *)local_c8.data;
          do {
            if (0 < (int)_h) {
              puVar25 = (undefined4 *)(sVar7 * sVar8 * uVar19 + (long)pvVar9);
              uVar21 = 0;
              puVar23 = puVar20;
              do {
                uVar24 = (ulong)_w;
                puVar27 = puVar23;
                if (0 < (int)_w) {
                  do {
                    *puVar25 = *puVar27;
                    puVar25 = puVar25 + 1;
                    puVar27 = puVar27 + _c;
                    uVar24 = uVar24 - 1;
                  } while (uVar24 != 0);
                }
                uVar21 = uVar21 + 1;
                puVar23 = (undefined4 *)
                          ((long)puVar23 +
                          local_c8.cstep *
                          CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
              } while (uVar21 != _h);
            }
            uVar19 = uVar19 + 1;
            puVar20 = puVar20 + 1;
          } while (uVar19 != _c);
        }
      }
      pMVar12 = local_d0;
      if (this->ndim == 4) {
        Mat::create(local_d0,_w,_h,_d,_c,sVar5,opt->blob_allocator);
        pvVar9 = pMVar12->data;
        if (((pvVar9 != (void *)0x0) && (sVar5 = pMVar12->cstep, (long)pMVar12->c * sVar5 != 0)) &&
           (local_140 = 0, 0 < (int)_c)) {
          sVar7 = pMVar12->elemsize;
          uVar19 = 0;
          do {
            if (0 < (int)_d) {
              puVar20 = (undefined4 *)(sVar5 * sVar7 * uVar19 + (long)pvVar9);
              uVar21 = 0;
              do {
                if (0 < (int)_h) {
                  uVar26 = uVar19 & 0xffffffff;
                  uVar24 = 0;
                  do {
                    iVar17 = (int)uVar26;
                    uVar22 = (ulong)_w;
                    if (0 < (int)_w) {
                      do {
                        *puVar20 = *(undefined4 *)
                                    ((long)local_c8.data +
                                    (long)(int)uVar26 * 4 +
                                    local_c8.cstep *
                                    CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize)
                                    * uVar21);
                        puVar20 = puVar20 + 1;
                        uVar26 = (ulong)((int)uVar26 + _c);
                        uVar22 = uVar22 - 1;
                      } while (uVar22 != 0);
                    }
                    uVar24 = uVar24 + 1;
                    uVar26 = (ulong)(iVar17 + _w * _c);
                  } while (uVar24 != _h);
                }
                uVar21 = uVar21 + 1;
              } while (uVar21 != _d);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != _c);
        }
      }
      else {
        local_140 = 0;
      }
    }
  }
LAB_0020622b:
  Mat::~Mat(&local_c8);
LAB_0020623d:
  if (local_118.refcount != (int *)0x0) {
    LOCK();
    *local_118.refcount = *local_118.refcount + -1;
    UNLOCK();
    if (*local_118.refcount == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        if ((undefined4 *)local_118.data != (undefined4 *)0x0) {
          free(local_118.data);
        }
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return local_140;
}

Assistant:

int Reshape::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    size_t elemsize = bottom_blob.elemsize;
    int total = bottom_blob.w * bottom_blob.h * bottom_blob.d * bottom_blob.c;

    int dims = bottom_blob.dims;

    // resolve out shape

    int outw = w;
    int outh = h;
    int outd = d;
    int outc = c;

    if (ndim == 1)
    {
        if (outw == 0)
            outw = bottom_blob.w;

        if (outw == -1)
            outw = total;

        if (dims == 1 && bottom_blob.w == outw)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }
    if (ndim == 2)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;

        if (outw == -1)
            outw = total / outh;
        if (outh == -1)
            outh = total / outw;

        if (dims == 2 && bottom_blob.h == outh)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }
    if (ndim == 3)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;
        if (outc == 0)
            outc = bottom_blob.c;

        if (outw == -1)
            outw = total / outc / outh;
        if (outh == -1)
            outh = total / outc / outw;
        if (outc == -1)
            outc = total / outh / outw;

        if (dims == 3 && bottom_blob.c == outc)
        {
            top_blob = bottom_blob;
            top_blob.w = outw;
            top_blob.h = outh;
            return 0;
        }
    }
    if (ndim == 4)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;
        if (outc == 0)
            outc = bottom_blob.c;
        if (outd == 0)
            outd = bottom_blob.d;

        if (outw == -1)
            outw = total / outc / outd / outh;
        if (outh == -1)
            outh = total / outc / outd / outw;
        if (outd == -1)
            outd = total / outc / outh / outw;
        if (outc == -1)
            outc = total / outd / outh / outw;

        if (dims == 4 && bottom_blob.c == outc)
        {
            top_blob = bottom_blob;
            top_blob.w = outw;
            top_blob.h = outh;
            top_blob.d = outd;
            return 0;
        }
    }

    bool need_permute = permute == 1;
    if (dims == 2 && ndim == 2 && bottom_blob.h == outh)
        need_permute = false;
    if (dims == 3 && ndim == 3 && bottom_blob.c == outc)
        need_permute = false;
    if (dims == 4 && ndim == 4 && bottom_blob.c == outc)
        need_permute = false;

    if (need_permute)
    {
        Mat bottom_blob_permuted = bottom_blob;

        if (dims == 2)
        {
            // hw -> wh
            int _w = bottom_blob.w;
            int _h = bottom_blob.h;

            bottom_blob_permuted.create(_h, _w, elemsize, opt.workspace_allocator);
            if (bottom_blob_permuted.empty())
                return -100;

            const float* ptr = bottom_blob;
            float* outptr = bottom_blob_permuted;

            for (int i = 0; i < _w; i++)
            {
                for (int j = 0; j < _h; j++)
                {
                    *outptr++ = ptr[j * _w + i];
                }
            }
        }
        if (dims == 3)
        {
            // chw -> hwc
            int _w = bottom_blob.w;
            int _h = bottom_blob.h;
            int channels = bottom_blob.c;

            bottom_blob_permuted.create(channels, _w, _h, elemsize, opt.workspace_allocator);
            if (bottom_blob_permuted.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < _h; q++)
            {
                float* outptr = bottom_blob_permuted.channel(q);

                for (int i = 0; i < _w; i++)
                {
                    for (int j = 0; j < channels; j++)
                    {
                        *outptr++ = bottom_blob.channel(j).row(q)[i];
                    }
                }
            }
        }

        if (dims == 4)
        {
            // cdhw -> dhwc
            int _w = bottom_blob.w;
            int _h = bottom_blob.h;
            int _d = bottom_blob.d;
            int channels = bottom_blob.c;

            bottom_blob_permuted.create(channels, _w, _h, _d, elemsize, opt.workspace_allocator);
            if (bottom_blob_permuted.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int z = 0; z < _d; z++)
            {
                float* outptr = bottom_blob_permuted.channel(z);

                for (int q = 0; q < _h; q++)
                {
                    for (int i = 0; i < _w; i++)
                    {
                        for (int j = 0; j < channels; j++)
                        {
                            *outptr++ = bottom_blob.channel(j).depth(z).row(q)[i];
                        }
                    }
                }
            }
        }

        if (ndim == 1)
        {
            top_blob = bottom_blob_permuted.reshape(outw, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        // permute on ndhwc/nhwc/nhc
        Mat top_blob_permuted;
        if (ndim == 2)
        {
            top_blob_permuted = bottom_blob_permuted.reshape(outh, outw, opt.workspace_allocator);
        }
        if (ndim == 3)
        {
            top_blob_permuted = bottom_blob_permuted.reshape(outc, outw, outh, opt.workspace_allocator);
        }
        if (ndim == 4)
        {
            top_blob_permuted = bottom_blob_permuted.reshape(outc, outw, outh, outd, opt.workspace_allocator);
        }
        if (top_blob_permuted.empty())
            return -100;

        if (ndim == 2)
        {
            // wh -> hw
            top_blob.create(outw, outh, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = top_blob_permuted;
            float* outptr = top_blob;

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    *outptr++ = ptr[j * outh + i];
                }
            }
        }
        if (ndim == 3)
        {
            // hwc -> chw
            top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    const float* ptr = top_blob_permuted.channel(i);

                    for (int j = 0; j < outw; j++)
                    {
                        *outptr++ = ptr[j * outc + q];
                    }
                }
            }
        }
        if (ndim == 4)
        {
            // dhwc -> cdhw
            top_blob.create(outw, outh, outd, outc, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int k = 0; k < outd; k++)
                {
                    const float* ptr = top_blob_permuted.channel(k);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            *outptr++ = ptr[i * outw * outc + j * outc + q];
                        }
                    }
                }
            }
        }

        return 0;
    }

    if (ndim == 1)
    {
        top_blob = bottom_blob.reshape(outw, opt.blob_allocator);
    }
    if (ndim == 2)
    {
        top_blob = bottom_blob.reshape(outw, outh, opt.blob_allocator);
    }
    if (ndim == 3)
    {
        top_blob = bottom_blob.reshape(outw, outh, outc, opt.blob_allocator);
    }
    if (ndim == 4)
    {
        top_blob = bottom_blob.reshape(outw, outh, outd, outc, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    return 0;
}